

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_set_decoded_components
                   (opj_j2k_t *p_j2k,OPJ_UINT32 numcomps,OPJ_UINT32 *comps_indices,
                   opj_event_mgr_t *p_manager)

{
  void *ptr;
  OPJ_UINT32 *pOVar1;
  OPJ_BOOL *already_mapped;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 *comps_indices_local;
  OPJ_UINT32 numcomps_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k->m_private_image == (opj_image_t *)0x0) {
    opj_event_msg(p_manager,1,
                  "opj_read_header() should be called before opj_set_decoded_components().\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    ptr = opj_calloc(4,(ulong)p_j2k->m_private_image->numcomps);
    if (ptr == (void *)0x0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      for (already_mapped._4_4_ = 0; already_mapped._4_4_ < numcomps;
          already_mapped._4_4_ = already_mapped._4_4_ + 1) {
        if (p_j2k->m_private_image->numcomps <= comps_indices[already_mapped._4_4_]) {
          opj_event_msg(p_manager,1,"Invalid component index: %u\n",
                        (ulong)comps_indices[already_mapped._4_4_]);
          opj_free(ptr);
          return 0;
        }
        if (*(int *)((long)ptr + (ulong)comps_indices[already_mapped._4_4_] * 4) != 0) {
          opj_event_msg(p_manager,1,"Component index %u used several times\n",
                        (ulong)comps_indices[already_mapped._4_4_]);
          opj_free(ptr);
          return 0;
        }
        *(undefined4 *)((long)ptr + (ulong)comps_indices[already_mapped._4_4_] * 4) = 1;
      }
      opj_free(ptr);
      opj_free((p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode);
      if (numcomps == 0) {
        (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode = (OPJ_UINT32 *)0x0;
      }
      else {
        pOVar1 = (OPJ_UINT32 *)opj_malloc((ulong)numcomps << 2);
        (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode = pOVar1;
        if ((p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode == (OPJ_UINT32 *)0x0) {
          (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode = 0;
          return 0;
        }
        memcpy((p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode,comps_indices,
               (ulong)numcomps << 2);
      }
      (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode = numcomps;
      p_j2k_local._4_4_ = 1;
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

OPJ_BOOL opj_j2k_set_decoded_components(opj_j2k_t *p_j2k,
                                        OPJ_UINT32 numcomps,
                                        const OPJ_UINT32* comps_indices,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_BOOL* already_mapped;

    if (p_j2k->m_private_image == NULL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "opj_read_header() should be called before "
                      "opj_set_decoded_components().\n");
        return OPJ_FALSE;
    }

    already_mapped = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                            p_j2k->m_private_image->numcomps);
    if (already_mapped == NULL) {
        return OPJ_FALSE;
    }

    for (i = 0; i < numcomps; i++) {
        if (comps_indices[i] >= p_j2k->m_private_image->numcomps) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Invalid component index: %u\n",
                          comps_indices[i]);
            opj_free(already_mapped);
            return OPJ_FALSE;
        }
        if (already_mapped[comps_indices[i]]) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Component index %u used several times\n",
                          comps_indices[i]);
            opj_free(already_mapped);
            return OPJ_FALSE;
        }
        already_mapped[comps_indices[i]] = OPJ_TRUE;
    }
    opj_free(already_mapped);

    opj_free(p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode);
    if (numcomps) {
        p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode =
            (OPJ_UINT32*) opj_malloc(numcomps * sizeof(OPJ_UINT32));
        if (p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode == NULL) {
            p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode = 0;
            return OPJ_FALSE;
        }
        memcpy(p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode,
               comps_indices,
               numcomps * sizeof(OPJ_UINT32));
    } else {
        p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode = NULL;
    }
    p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode = numcomps;

    return OPJ_TRUE;
}